

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_has_encrypted_entries(archive *_a)

{
  uint uVar1;
  long in_RDI;
  int format_supports_encryption;
  archive_read *a;
  archive *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  uVar1 = archive_read_format_capabilities(in_stack_ffffffffffffffd8);
  if ((in_RDI == 0) || ((uVar1 & 3) == 0)) {
    local_4 = -2;
  }
  else if ((*(long *)(in_RDI + 0x948) == 0) || (*(long *)(*(long *)(in_RDI + 0x948) + 0x50) == 0)) {
    local_4 = -1;
  }
  else {
    local_4 = (**(code **)(*(long *)(in_RDI + 0x948) + 0x50))(in_RDI);
  }
  return local_4;
}

Assistant:

int
archive_read_has_encrypted_entries(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int format_supports_encryption = archive_read_format_capabilities(_a)
			& (ARCHIVE_READ_FORMAT_CAPS_ENCRYPT_DATA | ARCHIVE_READ_FORMAT_CAPS_ENCRYPT_METADATA);

	if (!_a || !format_supports_encryption) {
		/* Format in general doesn't support encryption */
		return ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED;
	}

	/* A reader potentially has read enough data now. */
	if (a->format && a->format->has_encrypted_entries) {
		return (a->format->has_encrypted_entries)(a);
	}

	/* For any other reason we cannot say how many entries are there. */
	return ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;
}